

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rawseti(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  TValue *pTVar2;
  StkId pTVar3;
  
  pTVar1 = index2adr(L,idx);
  pTVar3 = L->top;
  pTVar2 = luaH_setnum(L,&((pTVar1->value).gc)->h,n);
  pTVar2->value = pTVar3[-1].value;
  pTVar2->tt = pTVar3[-1].tt;
  pTVar3 = L->top;
  if (((3 < pTVar3[-1].tt) && ((((pTVar3[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar1->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback(L,&((pTVar1->value).gc)->h);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti (lua_State *L, int idx, int n) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2adr(L, idx);
  api_check(L, ttistable(o));
  setobj2t(L, luaH_setnum(L, hvalue(o), n), L->top-1);
  luaC_barriert(L, hvalue(o), L->top-1);
  L->top--;
  lua_unlock(L);
}